

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<double>::Subst_Backward(TPZSkylMatrix<double> *this,TPZFMatrix<double> *B)

{
  double dVar1;
  int iVar2;
  int64_t iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double *pdVar4;
  double **ppdVar5;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<double> *in_RDI;
  double *BPtr;
  double *end_ki;
  double *elem_ki;
  double val;
  int64_t k;
  int64_t j;
  int64_t Dimension;
  char *in_stack_00000178;
  char *in_stack_00000180;
  uint7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  bool bVar6;
  long row;
  double *local_50;
  double *local_40;
  long local_30;
  long local_28;
  
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  iVar2 = (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  if ((iVar3 != CONCAT44(extraout_var,iVar2)) ||
     ((in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<double>::Error(in_stack_00000180,in_stack_00000178);
  }
  iVar2 = (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  if (CONCAT44(extraout_var_00,iVar2) != 0) {
    local_28 = 0;
    while (row = local_28, iVar3 = TPZBaseMatrix::Cols(in_RSI),
          local_30 = CONCAT44(extraout_var_00,iVar2), row < iVar3) {
      do {
        local_30 = local_30 + -1;
        bVar6 = false;
        if (0 < local_30) {
          pdVar4 = TPZFMatrix<double>::operator()(in_RDI,row,(ulong)in_stack_ffffffffffffff90);
          bVar6 = *pdVar4 == 0.0;
        }
      } while (bVar6);
      in_stack_ffffffffffffff97 = 0;
      for (; 0 < local_30; local_30 = local_30 + -1) {
        ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)&in_RDI->fElem,local_30);
        local_40 = *ppdVar5;
        ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)&in_RDI->fElem,local_30 + 1);
        pdVar4 = *ppdVar5;
        local_50 = TPZFMatrix<double>::operator()
                             (in_RDI,row,
                              CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
        *local_50 = *local_50 / *local_40;
        dVar1 = *local_50;
        while (local_40 = local_40 + 1, local_40 < pdVar4) {
          local_50[-1] = -*local_40 * dVar1 + local_50[-1];
          local_50 = local_50 + -1;
        }
      }
      local_28 = local_28 + 1;
    }
    for (local_28 = 0; iVar3 = TPZBaseMatrix::Cols(in_RSI), local_28 < iVar3;
        local_28 = local_28 + 1) {
      ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)&in_RDI->fElem,0);
      dVar1 = **ppdVar5;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_RDI,row,CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      *pdVar4 = *pdVar4 / dVar1;
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Backward(B)");
#endif
    int64_t Dimension = this->Dim();
    if(!Dimension) return 1;	// nothing to do
    int64_t j;
    for ( j = 0; j < B->Cols(); j++ )
    {
        int64_t k = Dimension-1;
        while (k>0 && (*B)(k,j) == TVar(0.)) {
            k--;
        }
        //		std::cout << "kstart " << k << std::endl;
        
        for (;k > 0; k-- )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar val;
            TVar *elem_ki = fElem[k];
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            *BPtr /= *elem_ki++;
            val = *BPtr;
            //	BPtr;
            // substract the column of the skyline matrix from the vector.
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    for( j = 0; j< B->Cols(); j++) (*B)(0,j) /= fElem[0][0];
    return( 1 );
}